

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

bool bssl::anon_unknown_0::CreateClientAndServer
               (UniquePtr<SSL> *out_client,UniquePtr<SSL> *out_server,SSL_CTX *client_ctx,
               SSL_CTX *server_ctx)

{
  _Head_base<0UL,_ssl_st_*,_false> _Var1;
  int iVar2;
  SSL *s;
  bool bVar3;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  BIO *bio2;
  BIO *bio1;
  _Head_base<0UL,_ssl_st_*,_false> local_48;
  _Head_base<0UL,_ssl_st_*,_false> local_40;
  BIO *local_38;
  BIO *local_30;
  
  s = SSL_new((SSL_CTX *)client_ctx);
  local_40._M_head_impl = (ssl_st *)s;
  local_48._M_head_impl = (ssl_st *)SSL_new((SSL_CTX *)server_ctx);
  if (s == (SSL *)0x0 || (SSL *)local_48._M_head_impl == (SSL *)0x0) {
    bVar3 = false;
  }
  else {
    SSL_set_connect_state(s);
    SSL_set_accept_state((SSL *)local_48._M_head_impl);
    iVar2 = BIO_new_bio_pair(&local_30,0,&local_38,0);
    bVar3 = iVar2 != 0;
    if (bVar3) {
      SSL_set_bio((SSL *)local_40._M_head_impl,local_30,local_30);
      SSL_set_bio((SSL *)local_48._M_head_impl,local_38,local_38);
      _Var1._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (ssl_st *)0x0;
      std::__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)out_client,_Var1._M_head_impl);
      _Var1._M_head_impl = local_48._M_head_impl;
      local_48._M_head_impl = (ssl_st *)0x0;
      std::__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)out_server,_Var1._M_head_impl);
    }
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_48);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_40);
  return bVar3;
}

Assistant:

static bool CreateClientAndServer(bssl::UniquePtr<SSL> *out_client,
                                  bssl::UniquePtr<SSL> *out_server,
                                  SSL_CTX *client_ctx, SSL_CTX *server_ctx) {
  bssl::UniquePtr<SSL> client(SSL_new(client_ctx)), server(SSL_new(server_ctx));
  if (!client || !server) {
    return false;
  }
  SSL_set_connect_state(client.get());
  SSL_set_accept_state(server.get());

  BIO *bio1, *bio2;
  if (!BIO_new_bio_pair(&bio1, 0, &bio2, 0)) {
    return false;
  }
  // SSL_set_bio takes ownership.
  SSL_set_bio(client.get(), bio1, bio1);
  SSL_set_bio(server.get(), bio2, bio2);

  *out_client = std::move(client);
  *out_server = std::move(server);
  return true;
}